

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_bool_t cf_str_switch_case(cf_char_t *s)

{
  char cVar1;
  char *local_20;
  cf_char_t *p;
  cf_char_t *s_local;
  
  local_20 = s;
  if (s == (cf_char_t *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      if ((*local_20 < 'a') || ('z' < *local_20)) {
        if ((*local_20 < 'A') || ('Z' < *local_20)) {
          cVar1 = *local_20;
        }
        else {
          cVar1 = *local_20 + ' ';
        }
        *local_20 = cVar1;
      }
      else {
        if ((*local_20 < 'a') || ('z' < *local_20)) {
          cVar1 = *local_20;
        }
        else {
          cVar1 = *local_20 + -0x20;
        }
        *local_20 = cVar1;
      }
    }
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

cf_bool_t cf_str_switch_case(cf_char_t* s) {
    cf_char_t* p = CF_NULL_PTR;
    if (!s) return CF_FALSE;

    for (p = s; *p != '\0'; p++) {
        if (CF_IS_LOWER_ALPHA(*p)) {
            *p = CF_TO_UPPER_ALPHA(*p);
        } else {
            *p = CF_TO_LOWER_ALPHA(*p);
        }
    }
    return CF_TRUE;
}